

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O2

double __thiscall
cimod::
BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
::get_quadratic(BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
                *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *label_i,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *label_j)

{
  double dVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)label_i);
  std::__cxx11::string::string((string *)&local_50,(string *)label_j);
  dVar1 = _mat(this,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return dVar1;
}

Assistant:

FloatType get_quadratic( IndexType label_i, IndexType label_j ) const {
      return _mat( label_i, label_j );
    }